

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *jp2,OPJ_BYTE *p_cmap_header_data,OPJ_UINT32 p_cmap_header_size
                          ,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 local_40;
  byte local_3a;
  byte local_39;
  OPJ_UINT32 l_value;
  OPJ_BYTE nr_channels;
  OPJ_BYTE i;
  opj_jp2_cmap_comp_t *cmap;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_cmap_header_size_local;
  OPJ_BYTE *p_cmap_header_data_local;
  opj_jp2_t *jp2_local;
  
  cmap = (opj_jp2_cmap_comp_t *)p_manager;
  p_manager_local._4_4_ = p_cmap_header_size;
  pOStack_20 = p_cmap_header_data;
  p_cmap_header_data_local = (OPJ_BYTE *)jp2;
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x4f7,
                  "OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_cmap_header_data != (OPJ_BYTE *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      if ((jp2->color).jp2_pclr == (opj_jp2_pclr_t *)0x0) {
        opj_event_msg(p_manager,1,"Need to read a PCLR box before the CMAP box.\n");
        jp2_local._4_4_ = 0;
      }
      else if (((jp2->color).jp2_pclr)->cmap == (opj_jp2_cmap_comp_t *)0x0) {
        local_3a = ((jp2->color).jp2_pclr)->nr_channels;
        if (p_cmap_header_size < (uint)local_3a << 2) {
          opj_event_msg(p_manager,1,"Insufficient data for CMAP box.\n");
          jp2_local._4_4_ = 0;
        }
        else {
          _l_value = opj_malloc((ulong)local_3a << 2);
          if (_l_value == (void *)0x0) {
            jp2_local._4_4_ = 0;
          }
          else {
            for (local_39 = 0; local_39 < local_3a; local_39 = local_39 + 1) {
              opj_read_bytes_LE(pOStack_20,&local_40,2);
              pOStack_20 = pOStack_20 + 2;
              *(short *)((long)_l_value + (ulong)local_39 * 4) = (short)local_40;
              opj_read_bytes_LE(pOStack_20,&local_40,1);
              pOStack_20 = pOStack_20 + 1;
              *(char *)((long)_l_value + (ulong)local_39 * 4 + 2) = (char)local_40;
              opj_read_bytes_LE(pOStack_20,&local_40,1);
              pOStack_20 = pOStack_20 + 1;
              *(char *)((long)_l_value + (ulong)local_39 * 4 + 3) = (char)local_40;
            }
            *(void **)(*(long *)(p_cmap_header_data_local + 0x98) + 0x18) = _l_value;
            jp2_local._4_4_ = 1;
          }
        }
      }
      else {
        opj_event_msg(p_manager,1,"Only one CMAP box is allowed.\n");
        jp2_local._4_4_ = 0;
      }
      return jp2_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x4f9,
                  "OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("p_cmap_header_data != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x4f8,
                "OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_cmap(opj_jp2_t * jp2,
                                  OPJ_BYTE * p_cmap_header_data,
                                  OPJ_UINT32 p_cmap_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_cmap_comp_t *cmap;
    OPJ_BYTE i, nr_channels;
    OPJ_UINT32 l_value;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_cmap_header_data != 00);
    assert(p_manager != 00);
    (void)p_cmap_header_size;

    /* Need nr_channels: */
    if (jp2->color.jp2_pclr == NULL) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Need to read a PCLR box before the CMAP box.\n");
        return OPJ_FALSE;
    }

    /* Part 1, I.5.3.5: 'There shall be at most one Component Mapping box
     * inside a JP2 Header box' :
    */
    if (jp2->color.jp2_pclr->cmap) {
        opj_event_msg(p_manager, EVT_ERROR, "Only one CMAP box is allowed.\n");
        return OPJ_FALSE;
    }

    nr_channels = jp2->color.jp2_pclr->nr_channels;
    if (p_cmap_header_size < (OPJ_UINT32)nr_channels * 4) {
        opj_event_msg(p_manager, EVT_ERROR, "Insufficient data for CMAP box.\n");
        return OPJ_FALSE;
    }

    cmap = (opj_jp2_cmap_comp_t*) opj_malloc(nr_channels * sizeof(
                opj_jp2_cmap_comp_t));
    if (!cmap) {
        return OPJ_FALSE;
    }


    for (i = 0; i < nr_channels; ++i) {
        opj_read_bytes(p_cmap_header_data, &l_value, 2);            /* CMP^i */
        p_cmap_header_data += 2;
        cmap[i].cmp = (OPJ_UINT16) l_value;

        opj_read_bytes(p_cmap_header_data, &l_value, 1);            /* MTYP^i */
        ++p_cmap_header_data;
        cmap[i].mtyp = (OPJ_BYTE) l_value;

        opj_read_bytes(p_cmap_header_data, &l_value, 1);            /* PCOL^i */
        ++p_cmap_header_data;
        cmap[i].pcol = (OPJ_BYTE) l_value;
    }

    jp2->color.jp2_pclr->cmap = cmap;

    return OPJ_TRUE;
}